

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.hpp
# Opt level: O2

longdouble * csv::internals::pow10<long_double>(longdouble *n)

{
  longdouble lVar1;
  longdouble lVar2;
  longdouble lVar3;
  longdouble lVar4;
  
  lVar1 = *n;
  lVar2 = -lVar1;
  lVar3 = lVar2;
  if (lVar2 <= lVar1 || lVar1 != lVar2) {
    lVar3 = lVar1;
  }
  for (lVar4 = (longdouble)0; lVar4 < lVar3; lVar4 = lVar4 + (longdouble)1) {
  }
  return (longdouble *)((ulong)(lVar2 < lVar1) << 4);
}

Assistant:

HEDLEY_CONST CONSTEXPR_14
        long double pow10(const T& n) noexcept {
            long double multiplicand = n > 0 ? 10 : 0.1,
                ret = 1;

            // Make all numbers positive
            T iterations = n > 0 ? n : -n;
            
            for (T i = 0; i < iterations; i++) {
                ret *= multiplicand;
            }

            return ret;
        }